

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestBase.cpp
# Opt level: O0

void Tests::Cleanup(void)

{
  uint local_10;
  uint local_c;
  uint i_1;
  uint i;
  
  for (local_c = 0; local_c < expressionEvaluionFails; local_c = local_c + 1) {
    free(*(void **)(expressionEvaluionFailInfo + (ulong)local_c * 0x10));
  }
  expressionEvaluionFails = 0;
  for (local_10 = 0; local_10 < instructionEvaluionFails; local_10 = local_10 + 1) {
    free(*(void **)(instructionEvaluionFailInfo + (ulong)local_10 * 0x10));
  }
  instructionEvaluionFails = 0;
  return;
}

Assistant:

void Tests::Cleanup()
{
	for(unsigned i = 0; i < expressionEvaluionFails; i++)
		free(expressionEvaluionFailInfo[i].reason);
	expressionEvaluionFails = 0;

	for(unsigned i = 0; i < instructionEvaluionFails; i++)
		free(instructionEvaluionFailInfo[i].reason);
	instructionEvaluionFails = 0;
}